

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateArgsortLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint uVar3;
  ActivationLinear *__val;
  NeuralNetworkLayer *pNVar4;
  uint uVar5;
  bool bVar6;
  LayerUnion LVar7;
  long *plVar8;
  undefined8 *puVar9;
  uint uVar10;
  size_type *psVar11;
  ActivationLinear *pAVar12;
  long *plVar13;
  ulong *puVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  string err;
  Result r;
  string __str;
  undefined1 local_188 [8];
  _Alloc_hider local_180;
  undefined1 local_178 [24];
  size_type *local_160;
  _Alloc_hider local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  NeuralNetworkLayer *local_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  long *local_f0;
  undefined8 local_e8;
  long local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  Result::Result((Result *)&local_160);
  validateInputCount((Result *)local_188,layer,1,1);
  local_160 = (size_type *)local_188;
  std::__cxx11::string::operator=((string *)&local_158,(string *)&local_180);
  bVar6 = Result::good((Result *)&local_160);
  pcVar2 = local_178 + 8;
  if (local_180._M_p != pcVar2) {
    operator_delete(local_180._M_p,local_178._8_8_ + 1);
  }
  if (bVar6) {
    local_138 = layer;
    validateOutputCount((Result *)local_188,layer,1,1);
    local_160 = (size_type *)local_188;
    std::__cxx11::string::operator=((string *)&local_158,(string *)&local_180);
    bVar6 = Result::good((Result *)&local_160);
    if (local_180._M_p != pcVar2) {
      operator_delete(local_180._M_p,local_178._8_8_ + 1);
    }
    if (bVar6) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Argsort","");
      validateInputOutputRankEquality((Result *)local_188,local_138,&local_50,&this->blobNameToRank)
      ;
      local_160 = (size_type *)local_188;
      std::__cxx11::string::operator=((string *)&local_158,(string *)&local_180);
      bVar6 = Result::good((Result *)&local_160);
      if (local_180._M_p != pcVar2) {
        operator_delete(local_180._M_p,local_178._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pNVar4 = local_138;
      if (bVar6) {
        if (local_138->_oneof_case_[0] == 0x5b5) {
          LVar7 = local_138->layer_;
        }
        else {
          LVar7.argsort_ = Specification::ArgSortLayerParams::default_instance();
        }
        __val = ((LVar7.activation_)->NonlinearityType_).linear_;
        if ((long)__val < 0) {
          std::operator+(&local_110,
                         "Value of \'axis\' is negative for layer of type \'ArgSort\' and name \'",
                         (pNVar4->name_).ptr_);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_110);
          local_188 = (undefined1  [8])local_178;
          psVar11 = (size_type *)(plVar8 + 2);
          if ((size_type *)*plVar8 == psVar11) {
            local_178._0_8_ = *psVar11;
            local_178._8_8_ = plVar8[3];
          }
          else {
            local_178._0_8_ = *psVar11;
            local_188 = (undefined1  [8])*plVar8;
          }
          local_180._M_p = (pointer)plVar8[1];
          *plVar8 = (long)psVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_188);
        }
        else {
          if (((pNVar4->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) ||
             (uVar3 = *(uint *)((long)((pNVar4->inputtensor_).super_RepeatedPtrFieldBase.rep_)->
                                      elements[0] + 0x24), (long)__val < (long)(int)uVar3))
          goto LAB_002dc998;
          uVar16 = 1;
          if ((ActivationLinear *)0x9 < __val) {
            pAVar12 = __val;
            uVar17 = 4;
            do {
              uVar16 = uVar17;
              if (pAVar12 < (ActivationLinear *)0x64) {
                uVar16 = uVar16 - 2;
                goto LAB_002dcb1d;
              }
              if (pAVar12 < (ActivationLinear *)0x3e8) {
                uVar16 = uVar16 - 1;
                goto LAB_002dcb1d;
              }
              if (pAVar12 < (ActivationLinear *)0x2710) goto LAB_002dcb1d;
              bVar6 = (ActivationLinear *)0x1869f < pAVar12;
              pAVar12 = (ActivationLinear *)((ulong)pAVar12 / 10000);
              uVar17 = uVar16 + 4;
            } while (bVar6);
            uVar16 = uVar16 + 1;
          }
LAB_002dcb1d:
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct((ulong)local_70,(char)uVar16);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_70[0],uVar16,(unsigned_long)__val);
          plVar8 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x31b0cc);
          local_b0 = &local_a0;
          plVar13 = plVar8 + 2;
          if ((long *)*plVar8 == plVar13) {
            local_a0 = *plVar13;
            lStack_98 = plVar8[3];
          }
          else {
            local_a0 = *plVar13;
            local_b0 = (long *)*plVar8;
          }
          local_a8 = plVar8[1];
          *plVar8 = (long)plVar13;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
          local_130 = &local_120;
          puVar14 = (ulong *)(plVar8 + 2);
          if ((ulong *)*plVar8 == puVar14) {
            local_120 = *puVar14;
            lStack_118 = plVar8[3];
          }
          else {
            local_120 = *puVar14;
            local_130 = (ulong *)*plVar8;
          }
          local_128 = plVar8[1];
          *plVar8 = (long)puVar14;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          uVar16 = -uVar3;
          if (0 < (int)uVar3) {
            uVar16 = uVar3;
          }
          uVar17 = 1;
          if (9 < uVar16) {
            uVar15 = (ulong)uVar16;
            uVar5 = 4;
            do {
              uVar17 = uVar5;
              uVar10 = (uint)uVar15;
              if (uVar10 < 100) {
                uVar17 = uVar17 - 2;
                goto LAB_002dcc72;
              }
              if (uVar10 < 1000) {
                uVar17 = uVar17 - 1;
                goto LAB_002dcc72;
              }
              if (uVar10 < 10000) goto LAB_002dcc72;
              uVar15 = uVar15 / 10000;
              uVar5 = uVar17 + 4;
            } while (99999 < uVar10);
            uVar17 = uVar17 + 1;
          }
LAB_002dcc72:
          local_d0 = local_c0;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_d0,(char)uVar17 - (char)((int)uVar3 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_d0),uVar17,uVar16);
          uVar15 = 0xf;
          if (local_130 != &local_120) {
            uVar15 = local_120;
          }
          if (uVar15 < (ulong)(local_c8 + local_128)) {
            uVar15 = 0xf;
            if (local_d0 != local_c0) {
              uVar15 = local_c0[0];
            }
            if (uVar15 < (ulong)(local_c8 + local_128)) goto LAB_002dccfb;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_130);
          }
          else {
LAB_002dccfb:
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0);
          }
          local_f0 = &local_e0;
          plVar8 = puVar9 + 2;
          if ((long *)*puVar9 == plVar8) {
            local_e0 = *plVar8;
            uStack_d8 = puVar9[3];
          }
          else {
            local_e0 = *plVar8;
            local_f0 = (long *)*puVar9;
          }
          local_e8 = puVar9[1];
          *puVar9 = plVar8;
          puVar9[1] = 0;
          *(undefined1 *)plVar8 = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
          plVar13 = plVar8 + 2;
          if ((long *)*plVar8 == plVar13) {
            local_80 = *plVar13;
            lStack_78 = plVar8[3];
            local_90 = &local_80;
          }
          else {
            local_80 = *plVar13;
            local_90 = (long *)*plVar8;
          }
          local_88 = plVar8[1];
          *plVar8 = (long)plVar13;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_90,
                                      (ulong)(((local_138->name_).ptr_)->_M_dataplus)._M_p);
          psVar11 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_110.field_2._M_allocated_capacity = *psVar11;
            local_110.field_2._8_8_ = plVar8[3];
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          }
          else {
            local_110.field_2._M_allocated_capacity = *psVar11;
            local_110._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_110._M_string_length = plVar8[1];
          *plVar8 = (long)psVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_110);
          local_188 = (undefined1  [8])local_178;
          psVar11 = (size_type *)(plVar8 + 2);
          if ((size_type *)*plVar8 == psVar11) {
            local_178._0_8_ = *psVar11;
            local_178._8_8_ = plVar8[3];
          }
          else {
            local_178._0_8_ = *psVar11;
            local_188 = (undefined1  [8])*plVar8;
          }
          local_180._M_p = (pointer)plVar8[1];
          *plVar8 = (long)psVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if (local_90 != &local_80) {
            operator_delete(local_90,local_80 + 1);
          }
          if (local_f0 != &local_e0) {
            operator_delete(local_f0,local_e0 + 1);
          }
          if (local_d0 != local_c0) {
            operator_delete(local_d0,local_c0[0] + 1);
          }
          if (local_130 != &local_120) {
            operator_delete(local_130,local_120 + 1);
          }
          if (local_b0 != &local_a0) {
            operator_delete(local_b0,local_a0 + 1);
          }
          if (local_70[0] != local_60) {
            operator_delete(local_70[0],local_60[0] + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_188);
        }
        if (local_188 != (undefined1  [8])local_178) {
          operator_delete((void *)local_188,local_178._0_8_ + 1);
        }
        goto LAB_002dc9e6;
      }
    }
  }
LAB_002dc998:
  *(size_type **)__return_storage_ptr__ = local_160;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_p == &local_148) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_148._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_158._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_158._M_p = (pointer)&local_148;
LAB_002dc9e6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_p != &local_148) {
    operator_delete(local_158._M_p,
                    CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateArgsortLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (!(r = validateInputCount(layer, 1, 1)).good()) return r;
    if (!(r = validateOutputCount(layer, 1, 1)).good()) return r;
    if (!(r = validateInputOutputRankEquality(layer, "Argsort", blobNameToRank)).good()) return r;

    const auto& params = layer.argsort();

    if (params.axis() < 0) {
        const std::string err = "Value of 'axis' is negative for layer of type 'ArgSort' and name '" + layer.name() + "', which is not supported. It must be positive.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < 0 || params.axis() >= rank) {
            const std::string err = "Value of 'axis' is " + std::to_string(params.axis()) + \
                                    ", but it must be in the range [0," \
                                    + std::to_string(rank) + ") for layer of type 'ArgSort' and name '" + layer.name() + "'.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return r;
}